

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O0

void __thiscall FileBuffer::FileBuffer(FileBuffer *this,char *file,int size,int segments)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *pcVar3;
  int *piVar4;
  ifstream *this_00;
  ulong uVar5;
  ifstream *fileStream;
  int i_1;
  int i;
  int segments_local;
  int size_local;
  char *file_local;
  FileBuffer *this_local;
  
  this->_vptr_FileBuffer = (_func_int **)&PTR__FileBuffer_00104da8;
  this->_bufferSize = 0;
  this->_segments = 0;
  this->_fileLength = 0;
  this->_fileSegmentLength = 0;
  this->_fileCurrentPos = 0;
  if (segments < 1) {
    printf("A buffer can\'t have less than 1 segment. Given segments: %d\n",(ulong)(uint)segments);
    __cxa_rethrow();
  }
  this->_bufferSize = size;
  this->_file = file;
  this->_segments = segments;
  uVar5 = (ulong)size;
  if ((long)uVar5 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pcVar3 = (char *)operator_new__(uVar5);
  this->_buffer = pcVar3;
  for (fileStream._4_4_ = 0; fileStream._4_4_ < this->_bufferSize;
      fileStream._4_4_ = fileStream._4_4_ + 1) {
    this->_buffer[fileStream._4_4_] = '\0';
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)segments;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  piVar4 = (int *)operator_new__(uVar5);
  this->_loadedSegments = piVar4;
  for (fileStream._0_4_ = 0; (int)fileStream < segments; fileStream._0_4_ = (int)fileStream + 1) {
    this->_loadedSegments[(int)fileStream] = -1;
  }
  this_00 = (ifstream *)operator_new(0x208);
  std::ifstream::ifstream(this_00);
  std::ifstream::open(this_00,this->_file,8);
  iVar2 = getFileLength(this,(ifstream *)this_00);
  this->_fileLength = iVar2;
  std::ifstream::close();
  this->_fileSegmentLength = this->_bufferSize / this->_segments;
  return;
}

Assistant:

FileBuffer::FileBuffer(char *file, int size, int segments) {
    if (segments < 1) {
        printf("A buffer can't have less than 1 segment. Given segments: %d\n", segments);
        throw;
    }

    _bufferSize = size;
    _file = file;
    _segments = segments;

    _buffer = new char[size];
    for (int i = 0; i < _bufferSize; i++) {
        _buffer[i] = '\0';
    }

    _loadedSegments = new int[segments];
    for (int i = 0; i < segments; i++) {
        _loadedSegments[i] = -1;
    }

    //open the file to get file length, then close it again
    ifstream *fileStream = new ifstream();
    fileStream->open(_file);
    _fileLength = getFileLength(fileStream);
    fileStream->close();

    _fileSegmentLength = _bufferSize / _segments;
}